

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O3

void duckdb::SetSelectionVectorSelect::SetSelectionVector
               (SelectionVector *selection_vector,ValidityMask *validity_mask,
               ValidityMask *input_validity,Vector *selection_entry,idx_t child_idx,
               idx_t *target_offset,idx_t selection_offset,idx_t input_offset,idx_t target_length)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unsigned_long *puVar2;
  byte bVar3;
  undefined8 uVar4;
  element_type *peVar5;
  int64_t iVar6;
  TemplatedValidityData<unsigned_long> *pTVar7;
  _Head_base<0UL,_unsigned_long_*,_false> _Var8;
  ulong uVar9;
  idx_t local_80;
  Value local_78;
  
  Vector::GetValue(&local_78,selection_entry,child_idx + selection_offset);
  iVar6 = Value::GetValue<long>(&local_78);
  Value::~Value(&local_78);
  uVar1 = *target_offset;
  if ((long)target_length < iVar6 || iVar6 < 1) {
    selection_vector->sel_vector[uVar1] = 0;
  }
  else {
    uVar9 = (input_offset + iVar6) - 1;
    selection_vector->sel_vector[uVar1] = (sel_t)uVar9;
    puVar2 = (input_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0))
    goto LAB_01415d32;
  }
  _Var8._M_head_impl = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (_Var8._M_head_impl == (unsigned_long *)0x0) {
    local_80 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
              ((duckdb *)&local_78,&local_80);
    peVar5 = local_78.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = local_78.type_._0_8_;
    local_78.type_.id_ = INVALID;
    local_78.type_.physical_type_ = ~INVALID;
    local_78.type_._2_6_ = 0;
    local_78.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    this = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
    (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar4;
    (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (local_78.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_78.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    pTVar7 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                       (&(validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
    _Var8._M_head_impl =
         (pTVar7->owned_data).
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var8._M_head_impl;
  }
  bVar3 = (byte)uVar1 & 0x3f;
  _Var8._M_head_impl[uVar1 >> 6] =
       _Var8._M_head_impl[uVar1 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
LAB_01415d32:
  *target_offset = *target_offset + 1;
  return;
}

Assistant:

static void SetSelectionVector(SelectionVector &selection_vector, ValidityMask &validity_mask,
	                               ValidityMask &input_validity, Vector &selection_entry, idx_t child_idx,
	                               idx_t &target_offset, idx_t selection_offset, idx_t input_offset,
	                               idx_t target_length) {
		auto sel_idx = selection_entry.GetValue(selection_offset + child_idx).GetValue<int64_t>() - 1;
		if (sel_idx >= 0 && sel_idx < UnsafeNumericCast<int64_t>(target_length)) {
			auto sel_idx_unsigned = UnsafeNumericCast<idx_t>(sel_idx);
			selection_vector.set_index(target_offset, input_offset + sel_idx_unsigned);
			if (!input_validity.RowIsValid(input_offset + sel_idx_unsigned)) {
				validity_mask.SetInvalid(target_offset);
			}
		} else {
			selection_vector.set_index(target_offset, 0);
			validity_mask.SetInvalid(target_offset);
		}
		target_offset++;
	}